

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall glslang::TSymbolTable::adoptLevels(TSymbolTable *this,TSymbolTable *symTable)

{
  size_type sVar1;
  reference __x;
  uint local_1c;
  uint level;
  TSymbolTable *symTable_local;
  TSymbolTable *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ::size(&symTable->table);
    if (sVar1 <= local_1c) break;
    __x = std::vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>::
          operator[](&symTable->table,(ulong)local_1c);
    std::vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>::
    push_back(&this->table,__x);
    this->adoptedLevels = this->adoptedLevels + 1;
    local_1c = local_1c + 1;
  }
  this->uniqueId = symTable->uniqueId;
  this->noBuiltInRedeclarations = (bool)(symTable->noBuiltInRedeclarations & 1);
  this->separateNameSpaces = (bool)(symTable->separateNameSpaces & 1);
  return;
}

Assistant:

void adoptLevels(TSymbolTable& symTable)
    {
        for (unsigned int level = 0; level < symTable.table.size(); ++level) {
            table.push_back(symTable.table[level]);
            ++adoptedLevels;
        }
        uniqueId = symTable.uniqueId;
        noBuiltInRedeclarations = symTable.noBuiltInRedeclarations;
        separateNameSpaces = symTable.separateNameSpaces;
    }